

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall PRED<RemSP>::PerformLabeling(PRED<RemSP> *this)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  int *piVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  uint *puVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar4 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar4,piVar4[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar12 = (uint *)operator_new__((ulong)(((*(int *)&pMVar5->field_0xc -
                                            (*(int *)&pMVar5->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar5->field_0x8 -
                                            (*(int *)&pMVar5->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  RemSP::P_ = puVar12;
  *puVar12 = 0;
  RemSP::length_ = 1;
  iVar28 = *(int *)&pMVar5->field_0xc;
  lVar29 = (long)iVar28;
  uVar17 = *(uint *)&pMVar5->field_0x8;
  if (0 < lVar29) {
    lVar30 = *(long *)&pMVar5->field_0x10;
    lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar23 = 0;
    do {
      iVar16 = (int)uVar23;
      if (*(char *)(lVar30 + iVar16) != '\0') {
        puVar12[RemSP::length_] = RemSP::length_;
        uVar11 = RemSP::length_ + 1;
        *(uint *)(lVar32 + (long)iVar16 * 4) = RemSP::length_;
        RemSP::length_ = uVar11;
        if (iVar28 <= iVar16 + 1) break;
        uVar23 = (ulong)(iVar16 + 1);
        while (*(char *)(lVar30 + uVar23) != '\0') {
          *(undefined4 *)(lVar32 + uVar23 * 4) =
               *(undefined4 *)(lVar32 + (long)((int)uVar23 + -1) * 4);
          uVar23 = uVar23 + 1;
          if (iVar28 == (int)uVar23) goto LAB_001a553f;
        }
      }
      uVar11 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar11;
    } while ((int)uVar11 < iVar28);
  }
LAB_001a553f:
  if (1 < (int)uVar17) {
    uVar23 = 1;
    lVar30 = lVar29 + -1;
    lVar32 = 0;
    do {
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar26 = *(long *)&pMVar5->field_0x10;
      lVar7 = **(long **)&pMVar5->field_0x48;
      lVar31 = lVar7 * uVar23;
      lVar20 = lVar26 + lVar31;
      pcVar24 = (char *)(lVar20 - lVar7);
      lVar8 = *(long *)&pMVar6->field_0x10;
      lVar9 = **(long **)&pMVar6->field_0x48;
      lVar13 = lVar9 * uVar23;
      puVar12 = (uint *)(lVar8 + lVar13);
      puVar27 = (uint *)((long)puVar12 - lVar9);
      iVar28 = (int)lVar30;
      if (iVar28 == 0) {
        if (*(char *)(lVar26 + lVar31) != '\0') {
          if (*pcVar24 == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar11 = RemSP::length_ + 1;
            *puVar12 = RemSP::length_;
            RemSP::length_ = uVar11;
          }
          else {
            *puVar12 = *puVar27;
          }
        }
      }
      else {
        lVar14 = lVar30;
        if (*(char *)(lVar26 + lVar31) == '\0') {
          uVar18 = 0;
          goto LAB_001a5675;
        }
        if (*pcVar24 == '\0') {
          if (pcVar24[1] == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar11 = RemSP::length_ + 1;
            *puVar12 = RemSP::length_;
            RemSP::length_ = uVar11;
            iVar16 = 0;
            goto LAB_001a5856;
          }
          *puVar12 = puVar27[1];
          uVar18 = 0;
          goto LAB_001a59ac;
        }
        *puVar12 = *puVar27;
        uVar18 = 0;
LAB_001a59e1:
        iVar16 = (int)uVar18;
        if (iVar16 + 1 < iVar28) {
          lVar25 = (long)iVar16;
          lVar15 = lVar13 + lVar25 * 4;
          lVar22 = 0;
          while( true ) {
            if (*(char *)(lVar25 + lVar31 + lVar26 + 1 + lVar22) == '\0') {
              uVar11 = (int)(lVar25 + 1) + (int)lVar22;
              goto LAB_001a5b0e;
            }
            if (*(char *)(lVar7 * lVar32 + lVar25 + lVar26 + 1 + lVar22) == '\0') break;
            *(undefined4 *)(lVar8 + 4 + lVar15 + lVar22 * 4) =
                 *(undefined4 *)(lVar9 * lVar32 + lVar25 * 4 + lVar8 + 4 + lVar22 * 4);
            lVar22 = lVar22 + 1;
            if (lVar25 + (1 - lVar29) + 1 + lVar22 == 0) {
              iVar16 = iVar16 + (int)lVar22;
              goto LAB_001a5aa9;
            }
          }
          uVar18 = lVar25 + 1 + lVar22;
          iVar16 = iVar16 + (int)lVar22;
          iVar10 = iVar16 + 2;
          if (pcVar24[iVar10] == '\0') {
            *(uint *)(lVar15 + lVar8 + 4 + lVar22 * 4) = puVar12[iVar16];
            iVar16 = (int)uVar18;
            goto LAB_001a5856;
          }
          uVar11 = RemSP::Merge(puVar12[iVar16],puVar27[iVar10]);
          *(uint *)(lVar15 + lVar8 + 4 + lVar22 * 4) = uVar11;
LAB_001a59ac:
          do {
            lVar15 = (long)(int)uVar18;
            uVar18 = lVar15 + 1;
            cVar3 = *(char *)(lVar20 + 1 + lVar15);
            if (iVar28 <= (int)uVar18) {
              if (cVar3 != '\0') {
                puVar12[lVar15 + 1] = puVar27[lVar15 + 1];
              }
              goto LAB_001a5adb;
            }
            if (cVar3 != '\0') {
              puVar12[lVar15 + 1] = puVar27[lVar15 + 1];
              goto LAB_001a59e1;
            }
LAB_001a5675:
            while( true ) {
              lVar25 = (long)(int)uVar18;
              lVar15 = lVar25 << 0x20;
              lVar22 = 0;
              do {
                lVar19 = lVar15;
                lVar21 = lVar19 >> 0x20;
                if (lVar30 <= lVar25 + lVar22 + 1) {
                  lVar26 = lVar19 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar20 + lVar26) == '\0') goto LAB_001a5adb;
                  if (pcVar24[lVar26] == '\0') {
                    if (pcVar24[lVar21] == '\0') {
                      RemSP::P_[RemSP::length_] = RemSP::length_;
                      uVar11 = RemSP::length_ + 1;
                      puVar12[lVar26] = RemSP::length_;
                      RemSP::length_ = uVar11;
                      goto LAB_001a5adb;
                    }
                    uVar11 = puVar27[lVar21];
                  }
                  else {
                    uVar11 = puVar27[lVar26];
                  }
                  puVar12[lVar26] = uVar11;
                  goto LAB_001a5adb;
                }
                lVar1 = lVar22 + 1;
                pcVar2 = (char *)(lVar25 + lVar31 + lVar26 + 1 + lVar22);
                lVar15 = lVar19 + 0x100000000;
                lVar22 = lVar1;
              } while (*pcVar2 == '\0');
              uVar18 = (uVar18 & 0xffffffff) + lVar1;
              if (*(char *)(lVar1 + lVar7 * lVar32 + lVar25 + lVar26) != '\0') {
                *(undefined4 *)(lVar13 + lVar25 * 4 + lVar8 + lVar1 * 4) =
                     *(undefined4 *)(lVar9 * lVar32 + lVar25 * 4 + lVar8 + lVar1 * 4);
                goto LAB_001a59e1;
              }
              lVar15 = lVar19 + 0x200000000 >> 0x20;
              if (pcVar24[lVar15] != '\0') break;
              if (pcVar24[lVar21] == '\0') {
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar11 = RemSP::length_ + 1;
                *(uint *)(lVar13 + lVar25 * 4 + lVar8 + lVar1 * 4) = RemSP::length_;
                RemSP::length_ = uVar11;
              }
              else {
                *(uint *)(lVar13 + lVar25 * 4 + lVar8 + lVar1 * 4) = puVar27[lVar21];
              }
              iVar16 = (int)uVar18;
LAB_001a5856:
              if (iVar28 <= iVar16 + 1) {
                lVar14 = (long)(iVar16 + 1);
LAB_001a591c:
                if (*(char *)(lVar20 + lVar14) == '\0') goto LAB_001a5adb;
                goto LAB_001a5abb;
              }
              lVar22 = (long)iVar16;
              lVar25 = lVar22 << 0x20;
              lVar15 = lVar13 + lVar22 * 4;
              lVar19 = lVar8 + lVar15;
              lVar21 = 0;
              while (*(char *)(lVar31 + lVar22 + lVar26 + 1 + lVar21) != '\0') {
                if (*(char *)(lVar7 * lVar32 + lVar22 + lVar26 + 2 + lVar21) != '\0') {
                  uVar18 = (ulong)(uint)(iVar16 + 1 + (int)lVar21);
                  uVar11 = RemSP::Merge(*(uint *)((long)puVar12 + (lVar25 >> 0x1e)),
                                        *(uint *)(lVar9 * lVar32 + lVar22 * 4 + lVar8 + 8 +
                                                 lVar21 * 4));
                  *(uint *)(lVar15 + lVar8 + 4 + lVar21 * 4) = uVar11;
                  goto LAB_001a59ac;
                }
                *(undefined4 *)(lVar19 + 4 + lVar21 * 4) = *(undefined4 *)(lVar19 + lVar21 * 4);
                lVar25 = lVar25 + 0x100000000;
                lVar21 = lVar21 + 1;
                if ((1 - lVar29) + lVar22 + 1 + lVar21 == 0) {
                  iVar16 = iVar16 + (int)lVar21;
                  goto LAB_001a591c;
                }
              }
              uVar11 = iVar16 + 1 + (int)lVar21;
LAB_001a5b0e:
              uVar18 = (ulong)uVar11;
            }
            if (pcVar24[lVar21] == '\0') {
              uVar11 = puVar27[lVar15];
            }
            else {
              uVar11 = RemSP::Merge(puVar27[lVar21],puVar27[lVar15]);
            }
            *(uint *)(lVar13 + lVar25 * 4 + lVar8 + lVar1 * 4) = uVar11;
          } while( true );
        }
        lVar14 = (long)(iVar16 + 1);
LAB_001a5aa9:
        if (*(char *)(lVar20 + lVar14) != '\0') {
          if (pcVar24[lVar14] == '\0') {
LAB_001a5abb:
            uVar11 = puVar12[iVar16];
          }
          else {
            uVar11 = puVar27[lVar14];
          }
          puVar12[lVar14] = uVar11;
        }
      }
LAB_001a5adb:
      uVar23 = uVar23 + 1;
      lVar32 = lVar32 + 1;
      puVar12 = RemSP::P_;
    } while (uVar23 != uVar17);
  }
  uVar17 = 1;
  if (1 < RemSP::length_) {
    uVar17 = 1;
    uVar23 = 1;
    do {
      if (puVar12[uVar23] < uVar23) {
        uVar11 = puVar12[puVar12[uVar23]];
      }
      else {
        uVar11 = uVar17;
        uVar17 = uVar17 + 1;
      }
      puVar12[uVar23] = uVar11;
      uVar23 = uVar23 + 1;
    } while (uVar23 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar17;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar28 = *(int *)&pMVar6->field_0x8;
  if (0 < iVar28) {
    lVar29 = *(long *)&pMVar6->field_0x10;
    lVar30 = **(long **)&pMVar6->field_0x48;
    lVar32 = 0;
    do {
      iVar16 = *(int *)&pMVar6->field_0xc;
      if ((long)iVar16 != 0) {
        lVar26 = 0;
        do {
          *(uint *)(lVar29 + lVar26) = puVar12[*(uint *)(lVar29 + lVar26)];
          lVar26 = lVar26 + 4;
        } while ((long)iVar16 * 4 != lVar26);
        iVar28 = *(int *)&pMVar6->field_0x8;
      }
      lVar32 = lVar32 + 1;
      lVar29 = lVar29 + lVar30;
    } while (lVar32 < iVar28);
  }
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }